

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSettingsInstallHandler(ImGuiContext *context)

{
  undefined1 local_60 [8];
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  ImGuiContext *context_local;
  
  ini_handler.UserData = context;
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)local_60);
  local_60 = (undefined1  [8])0x20ee17;
  ini_handler.TypeName._0_4_ = ImHashStr("Table",0,0);
  ini_handler._8_8_ = TableSettingsHandler_ClearAll;
  ini_handler.ReadInitFn = TableSettingsHandler_ReadOpen;
  ini_handler.ReadOpenFn = TableSettingsHandler_ReadLine;
  ini_handler.ReadLineFn = TableSettingsHandler_ApplyAll;
  ini_handler.ApplyAllFn = TableSettingsHandler_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_back
            ((ImVector<ImGuiSettingsHandler> *)((long)ini_handler.UserData + 0x5310),
             (ImGuiSettingsHandler *)local_60);
  return;
}

Assistant:

void ImGui::TableSettingsInstallHandler(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Table";
    ini_handler.TypeHash = ImHashStr("Table");
    ini_handler.ClearAllFn = TableSettingsHandler_ClearAll;
    ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = TableSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}